

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateRegressorInterface
                   (Result *__return_storage_ptr__,ModelDescription *description,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  bool bVar1;
  string *psVar2;
  CoreML *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_c1;
  TypeCase local_c0 [2];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [75];
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  ValidationPolicy *local_28;
  ValidationPolicy *validationPolicy_local;
  ModelDescription *pMStack_18;
  int modelVersion_local;
  ModelDescription *description_local;
  Result *result;
  
  local_28 = validationPolicy;
  validationPolicy_local._4_4_ = modelVersion;
  pMStack_18 = description;
  description_local = (ModelDescription *)__return_storage_ptr__;
  psVar2 = Specification::ModelDescription::predictedfeaturename_abi_cxx11_(description);
  bVar1 = std::operator==(psVar2,"");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Specification is missing regressor predictedFeatureName.",
               &local_49);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    local_5d = 0;
    validateFeatureDescriptions<CoreML::Specification::ModelDescription>
              (__return_storage_ptr__,pMStack_18,validationPolicy_local._4_4_,local_28);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      this = (CoreML *)Specification::ModelDescription::output(pMStack_18);
      psVar2 = Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMStack_18);
      local_c0[0] = kDoubleType;
      local_c0[1] = 5;
      local_b8 = local_c0;
      local_b0 = 2;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_c1);
      __l._M_len = local_b0;
      __l._M_array = local_b8;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_a8,__l,&local_c1);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)(local_a8 + 0x18),this,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,
                 (string *)local_a8,in_R8);
      Result::operator=(__return_storage_ptr__,(Result *)(local_a8 + 0x18));
      Result::~Result((Result *)(local_a8 + 0x18));
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_a8);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_c1);
      Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateRegressorInterface(const Specification::ModelDescription& description, int modelVersion, const ValidationPolicy& validationPolicy) {

        if (description.predictedfeaturename() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing regressor predictedFeatureName.");
        }

        // Validate feature descriptions
        Result result = validateFeatureDescriptions(description, modelVersion, validationPolicy);
        if (!result.good()) {
            return result;
        }

        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   description.predictedfeaturename(),
                                                                   {Specification::FeatureType::kDoubleType, Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        return result;
    }